

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.cpp
# Opt level: O2

bool __thiscall hmm::createMaps(hmm *this)

{
  string *psVar1;
  string *psVar2;
  mapped_type mVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  ulong uVar10;
  int iVar11;
  double dVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_b0;
  string *local_a8;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_a0;
  _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_98;
  _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_90;
  string *local_88;
  _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_80;
  hmm *local_78;
  string previousCount2;
  string previousCount1;
  
  std::__cxx11::string::string((string *)&previousCount1,"0",(allocator *)&previousCount2);
  std::__cxx11::string::string((string *)&previousCount2,"0",(allocator *)&local_d0);
  psVar1 = &this->code1;
  local_88 = &this->qual1;
  psVar2 = &this->code2;
  local_a8 = &this->qual2;
  local_80 = (_Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->observedChroma1;
  local_90 = (_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->qualityMap1;
  local_98 = (_Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->observedChroma2;
  local_b0 = (_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->qualityMap2;
  local_a0 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->distanceMap;
  uVar10 = 0;
  iVar11 = 0;
  local_78 = this;
  while( true ) {
    if (((((local_78->code1)._M_string_length <= uVar10) ||
         ((local_78->qual1)._M_string_length <= uVar10)) ||
        ((local_78->code2)._M_string_length <= uVar10)) ||
       ((local_78->qual2)._M_string_length <= uVar10)) break;
    pcVar6 = (char *)std::__cxx11::string::at((ulong)psVar1);
    if (*pcVar6 == 'O') {
LAB_0017f8ea:
      pcVar6 = (char *)std::__cxx11::string::at((ulong)psVar2);
      if (*pcVar6 == 'O') {
LAB_0017f912:
        bVar4 = std::operator!=(&previousCount1,&previousCount2);
        if (!bVar4) {
          if (iVar11 == 0) {
            local_d0._M_dataplus._M_p._0_4_ = 1;
            pmVar9 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_a0,(key_type *)&local_d0);
            *pmVar9 = 0;
            pmVar7 = (mapped_type *)std::__cxx11::string::at((ulong)psVar1);
            mVar3 = *pmVar7;
            local_d0._M_dataplus._M_p._0_4_ = 1;
            pmVar7 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_80,(key_type *)&local_d0);
            *pmVar7 = mVar3;
            pcVar6 = (char *)std::__cxx11::string::at((ulong)local_88);
            dVar12 = pow(10.0,(double)-(int)*pcVar6 / 10.0);
            local_d0._M_dataplus._M_p._0_4_ = 1;
            pmVar8 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_90,(key_type *)&local_d0);
            *pmVar8 = dVar12;
            pmVar7 = (mapped_type *)std::__cxx11::string::at((ulong)psVar2);
            mVar3 = *pmVar7;
            local_d0._M_dataplus._M_p._0_4_ = 1;
            pmVar7 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_98,(key_type *)&local_d0);
            *pmVar7 = mVar3;
            pcVar6 = (char *)std::__cxx11::string::at((ulong)local_a8);
            dVar12 = pow(10.0,(double)-(int)*pcVar6 / 10.0);
            local_d0._M_dataplus._M_p._0_4_ = 1;
            pmVar8 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_b0,(key_type *)&local_d0);
            *pmVar8 = dVar12;
            std::__cxx11::string::assign((char *)&previousCount1);
            std::__cxx11::string::assign((char *)&previousCount2);
            iVar11 = 1;
          }
          else {
            pmVar7 = (mapped_type *)std::__cxx11::string::at((ulong)psVar1);
            mVar3 = *pmVar7;
            iVar11 = iVar11 + 1;
            local_d0._M_dataplus._M_p._0_4_ = iVar11;
            pmVar7 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_80,(key_type *)&local_d0);
            *pmVar7 = mVar3;
            pcVar6 = (char *)std::__cxx11::string::at((ulong)local_88);
            dVar12 = pow(10.0,(double)-(int)*pcVar6 / 10.0);
            local_d0._M_dataplus._M_p._0_4_ = iVar11;
            pmVar8 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_90,(key_type *)&local_d0);
            *pmVar8 = dVar12;
            pmVar7 = (mapped_type *)std::__cxx11::string::at((ulong)psVar2);
            mVar3 = *pmVar7;
            local_d0._M_dataplus._M_p._0_4_ = iVar11;
            pmVar7 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_char>,_std::allocator<std::pair<const_int,_char>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_98,(key_type *)&local_d0);
            *pmVar7 = mVar3;
            pcVar6 = (char *)std::__cxx11::string::at((ulong)local_a8);
            dVar12 = pow(10.0,(double)-(int)*pcVar6 / 10.0);
            local_d0._M_dataplus._M_p._0_4_ = iVar11;
            pmVar8 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_b0,(key_type *)&local_d0);
            *pmVar8 = dVar12;
            iVar5 = std::__cxx11::stoi(&previousCount1,(size_t *)0x0,10);
            local_d0._M_dataplus._M_p._0_4_ = iVar11;
            pmVar9 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_a0,(key_type *)&local_d0);
            *pmVar9 = iVar5;
            std::__cxx11::string::assign((char *)&previousCount1);
            std::__cxx11::string::assign((char *)&previousCount2);
          }
          goto LAB_0017fc3a;
        }
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::at((ulong)psVar2);
        if (*pcVar6 == 'C') goto LAB_0017f912;
      }
      bVar4 = false;
      goto LAB_0017fc57;
    }
    pcVar6 = (char *)std::__cxx11::string::at((ulong)psVar1);
    if (*pcVar6 == 'C') goto LAB_0017f8ea;
    bVar4 = std::operator==(&previousCount1,"0");
    if (bVar4) {
LAB_0017fb9b:
      pcVar6 = (char *)std::__cxx11::string::at((ulong)psVar1);
      std::__cxx11::string::operator=((string *)&previousCount1,*pcVar6);
      pcVar6 = (char *)std::__cxx11::string::at((ulong)psVar2);
      std::__cxx11::string::operator=((string *)&previousCount2,*pcVar6);
    }
    else {
      bVar4 = std::operator==(&previousCount2,"0");
      if (bVar4) goto LAB_0017fb9b;
      pcVar6 = (char *)std::__cxx11::string::at((ulong)psVar1);
      std::operator+(&local_d0,&previousCount1,*pcVar6);
      std::__cxx11::string::operator=((string *)&previousCount1,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      pcVar6 = (char *)std::__cxx11::string::at((ulong)psVar2);
      std::operator+(&local_d0,&previousCount2,*pcVar6);
      std::__cxx11::string::operator=((string *)&previousCount2,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
LAB_0017fc3a:
    uVar10 = uVar10 + 1;
  }
  local_78->T = iVar11;
  bVar4 = local_78->minGCPositions <= iVar11;
LAB_0017fc57:
  std::__cxx11::string::~string((string *)&previousCount2);
  std::__cxx11::string::~string((string *)&previousCount1);
  return bVar4;
}

Assistant:

bool hmm::createMaps(){
    int i = 0;
    int numGCPos = 0;
    string previousCount1 = "0";
    string previousCount2 = "0";
    //cout<<"here1"<<endl;
    while(i<this->code1.size() && i<this->qual1.size() && i<this->code2.size() && i<this->qual2.size()){
        //cout<<"here2: "<<i<<endl;
        if(this->code1.at(i)=='O'||this->code1.at(i)=='C'){
            if(this->code2.at(i)=='O'||this->code2.at(i)=='C'){
                if(previousCount1!=previousCount2){
                    return false;
                }
                if(numGCPos==0){
                    distanceMap[numGCPos+1] = (0);
                    observedChroma1[numGCPos+1] = (this->code1.at(i));
                    this->qualityMap1[numGCPos+1] = (pow(10,(-this->qual1.at(i)/(double)10)));
                    //qualityMap1.push_back(qual1.at(i));
                    observedChroma2[numGCPos+1] = (this->code2.at(i));
                    qualityMap2[numGCPos+1] = (pow(10,(-this->qual2.at(i)/(double)10)));
                    //qualityMap2.push_back(qual2.at(i));
                    previousCount1 = "0";
                    previousCount2 = "0";
                    numGCPos += 1;
                    i++;
                    continue;
                }
                observedChroma1[numGCPos+1] = (this->code1.at(i));
                qualityMap1[numGCPos+1] = (pow(10,(-this->qual1.at(i)/(double)10)));
                //qualityMap1.push_back(qual1.at(i));
                observedChroma2[numGCPos+1] = (this->code2.at(i));
                qualityMap2[numGCPos+1] = (pow(10,(-this->qual2.at(i)/(double)10)));
                //qualityMap2.push_back(qual2.at(i));
                distanceMap[numGCPos+1] = std::stoi(previousCount1);
                numGCPos += 1;
                previousCount1 = "0";
                previousCount2 = "0";
            }else{
                return false;
            }
        }else{
            if(previousCount1=="0"||previousCount2=="0"){
                previousCount1 = code1.at(i);
                previousCount2 = code2.at(i);
            }else{
                previousCount1 = previousCount1 + code1.at(i);
                previousCount2 = previousCount2 + code2.at(i);
            }
        }
        i++;
    }
    T = numGCPos;
    if(T<this->minGCPositions){
        return false;
    }
    return true;
}